

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogUnWrapURN(xmlChar *urn)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  xmlChar result [2000];
  byte local_7d8 [2000];
  
  iVar2 = xmlStrncmp(urn,(xmlChar *)"urn:publicid:",0xd);
  if (iVar2 == 0) {
    bVar7 = urn[0xd];
    uVar3 = 0;
    if (bVar7 == 0) {
      uVar6 = 0;
    }
    else {
      pbVar5 = urn + 0xd;
      uVar6 = 0;
      do {
        if (bVar7 < 0x3a) {
          if (bVar7 != 0x25) {
            if (bVar7 == 0x2b) {
              uVar3 = uVar3 + 1;
              local_7d8[uVar6] = 0x20;
            }
            else {
LAB_00165ecd:
              uVar3 = uVar3 + 1;
              local_7d8[uVar6] = bVar7;
            }
            goto LAB_00165f19;
          }
          if (pbVar5[1] == 0x33) {
            bVar7 = pbVar5[2];
            if (bVar7 == 0x41) {
              bVar7 = 0x3a;
            }
            else if (bVar7 == 0x42) {
              bVar7 = 0x3b;
            }
            else {
              if (bVar7 != 0x46) goto LAB_00165f60;
              bVar7 = 0x3f;
            }
LAB_00165f7d:
            local_7d8[uVar6] = bVar7;
            uVar3 = uVar3 + 1;
            pbVar5 = pbVar5 + 3;
          }
          else {
            if (pbVar5[1] == 0x32) {
              bVar1 = pbVar5[2];
              if (bVar1 < 0x37) {
                if (bVar1 == 0x33) {
                  bVar7 = 0x23;
                }
                else {
                  if (bVar1 != 0x35) goto LAB_00165f60;
                  bVar7 = 0x25;
                }
              }
              else if (bVar1 == 0x37) {
                bVar7 = 0x27;
              }
              else {
                bVar7 = 0x2b;
                if (bVar1 != 0x42) {
                  if (bVar1 != 0x46) goto LAB_00165f60;
                  bVar7 = 0x2f;
                }
              }
              goto LAB_00165f7d;
            }
LAB_00165f60:
            pbVar5 = pbVar5 + 1;
            uVar3 = uVar3 + 1;
            local_7d8[uVar6] = 0x25;
          }
        }
        else {
          if (bVar7 == 0x3a) {
            uVar8 = (ulong)uVar3;
            local_7d8[uVar6] = 0x2f;
            uVar3 = uVar3 + 2;
            local_7d8[uVar8 + 1] = 0x2f;
          }
          else {
            if (bVar7 != 0x3b) goto LAB_00165ecd;
            uVar8 = (ulong)uVar3;
            local_7d8[uVar6] = 0x3a;
            uVar3 = uVar3 + 2;
            local_7d8[uVar8 + 1] = 0x3a;
          }
LAB_00165f19:
          pbVar5 = pbVar5 + 1;
        }
        bVar7 = *pbVar5;
        uVar6 = (ulong)uVar3;
      } while ((bVar7 != 0) && (uVar3 < 0x7cd));
    }
    local_7d8[uVar6] = 0;
    pxVar4 = xmlStrdup(local_7d8);
  }
  else {
    pxVar4 = (xmlChar *)0x0;
  }
  return pxVar4;
}

Assistant:

static xmlChar *
xmlCatalogUnWrapURN(const xmlChar *urn) {
    xmlChar result[2000];
    unsigned int i = 0;

    if (xmlStrncmp(urn, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1))
	return(NULL);
    urn += sizeof(XML_URN_PUBID) - 1;

    while (*urn != 0) {
	if (i > sizeof(result) - 4)
	    break;
	if (*urn == '+') {
	    result[i++] = ' ';
	    urn++;
	} else if (*urn == ':') {
	    result[i++] = '/';
	    result[i++] = '/';
	    urn++;
	} else if (*urn == ';') {
	    result[i++] = ':';
	    result[i++] = ':';
	    urn++;
	} else if (*urn == '%') {
	    if ((urn[1] == '2') && (urn[2] == 'B'))
		result[i++] = '+';
	    else if ((urn[1] == '3') && (urn[2] == 'A'))
		result[i++] = ':';
	    else if ((urn[1] == '2') && (urn[2] == 'F'))
		result[i++] = '/';
	    else if ((urn[1] == '3') && (urn[2] == 'B'))
		result[i++] = ';';
	    else if ((urn[1] == '2') && (urn[2] == '7'))
		result[i++] = '\'';
	    else if ((urn[1] == '3') && (urn[2] == 'F'))
		result[i++] = '?';
	    else if ((urn[1] == '2') && (urn[2] == '3'))
		result[i++] = '#';
	    else if ((urn[1] == '2') && (urn[2] == '5'))
		result[i++] = '%';
	    else {
		result[i++] = *urn;
		urn++;
		continue;
	    }
	    urn += 3;
	} else {
	    result[i++] = *urn;
	    urn++;
	}
    }
    result[i] = 0;

    return(xmlStrdup(result));
}